

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfinityTests.cpp
# Opt level: O2

void __thiscall
IsNotNegativeInfinityTests::~IsNotNegativeInfinityTests(IsNotNegativeInfinityTests *this)

{
  ut11::TestFixture::~TestFixture(&this->super_TestFixture);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run() {
		Then("Is::Not::NegativeInfinity(0.0f) is Not::False", []() {
			AssertThat(ut11::Is::Not::NegativeInfinity(0.0f), ut11::Is::Not::False);
		});

		Then("Is::Not::NegativeInfinity(-Infinity) is Not::True", []() {
			AssertThat(ut11::Is::Not::NegativeInfinity(-std::numeric_limits<float>::infinity()), ut11::Is::Not::True);
		});

		Then("Is::Not::NegativeInfinity(+Infinity) is Not::False", []() {
			AssertThat(ut11::Is::Not::NegativeInfinity(std::numeric_limits<float>::infinity()), ut11::Is::Not::False);
		});

		Then("Is::Not::NegativeInfinity is Operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::NegativeInfinity) >::value, ut11::Is::True);
		});

		Then("Is::Not::NegativeInfinity has an error message", []() {
			AssertThat(ut11::Is::Not::NegativeInfinity.GetErrorMessage(0.0f), ut11::Is::Not::EqualTo(""));
		});
	}